

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

path * lookup_file_insensitive
                 (path *__return_storage_ptr__,path *path,string *filename,string *error_msg)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  path *ppVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  error_code ec;
  directory_iterator __end1;
  path local_d0;
  directory_iterator di;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_98;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::directory_iterator::directory_iterator(&di,path,&ec);
  if (ec._M_value == 0) {
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)local_158,path);
    std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_98,
               (__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> *)local_158
              );
    local_178._M_dataplus._M_p = (pointer)local_98._M_ptr;
    local_178._M_string_length = (size_type)local_98._M_refcount._M_pi;
    local_98._M_ptr = (element_type *)0x0;
    local_98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
    std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,
               (__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> *)local_158
              );
    __end1._M_dir._M_ptr = (element_type *)0x0;
    __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    while ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_string_length !=
           __end1._M_dir._M_refcount._M_pi) {
      ppVar4 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                                 ((directory_iterator *)&local_178);
      std::filesystem::__cxx11::path::filename(&local_d0,ppVar4);
      std::filesystem::__cxx11::path::string(&local_138,&local_d0);
      bVar3 = compare_string_insensitive(&local_138,filename);
      std::__cxx11::string::~string((string *)&local_138);
      std::filesystem::__cxx11::path::~path(&local_d0);
      if (bVar3) {
        std::filesystem::__cxx11::path::path(__return_storage_ptr__,ppVar4);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount)
        ;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
        goto LAB_0010d54c;
      }
      std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)&local_178);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_158 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   filename,": file not found in \'");
    std::filesystem::__cxx11::path::string(&local_178,path);
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_178);
    std::operator+(&local_d0._M_pathname,&local_138,"\'.");
    std::__cxx11::string::operator=((string *)error_msg,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_178);
    ppVar4 = (path *)local_158;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1,
                   "Error looking up \'",filename);
    std::operator+(&local_178,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end1,
                   "\' in \'");
    std::filesystem::__cxx11::path::string(&local_50,path);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   &local_178,local_50._M_dataplus._M_p);
    std::operator+(&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "\': ");
    (**(code **)(*(long *)ec._M_cat + 0x20))(&local_70,ec._M_cat,ec._M_value);
    std::operator+(&local_d0._M_pathname,&local_138,&local_70);
    std::__cxx11::string::operator=((string *)error_msg,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&__end1);
    pcVar1 = (filename->_M_dataplus)._M_p;
    std::filesystem::__cxx11::path::string(&local_d0._M_pathname,path);
    iVar2 = ec._M_value;
    (**(code **)(*(long *)ec._M_cat + 0x20))(&local_138,ec._M_cat,ec._M_value);
    SDL_LogError(1,"Error looking up \'%s\' in \'%s\': %d - %s",pcVar1,
                 local_d0._M_pathname._M_dataplus._M_p,iVar2,local_138._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_138);
    ppVar4 = &local_d0;
  }
  std::__cxx11::string::~string((string *)ppVar4);
  std::filesystem::__cxx11::path::path(__return_storage_ptr__);
LAB_0010d54c:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&di._M_dir._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

filesystem::path lookup_file_insensitive(const filesystem::path &path, const std::string &filename, std::string &error_msg) {
	std::error_code ec;
	filesystem::directory_iterator di{path, ec};

	if (ec) {
		error_msg = "Error looking up '" + filename + "' in '" + path.string().c_str() + "': " + ec.message();
		SDL_LogError(SDL_LOG_CATEGORY_ERROR, "Error looking up '%s' in '%s': %d - %s", filename.c_str(), path.string().c_str(), ec.value(), ec.message().c_str());
		return {};
	}

	for(auto& p: filesystem::directory_iterator(path)) {
		if (compare_string_insensitive(p.path().filename().string(), filename)) {
			return p.path();
		}
	}
	error_msg = filename + ": file not found in '" + path.string() + "'.";
	return {};
}